

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,double val)

{
  value_t vVar1;
  json_value jVar2;
  char *pcVar3;
  string *val_00;
  reference pvVar4;
  undefined4 in_register_00000034;
  string_view valname;
  double val_local;
  json json;
  complex<double> cvec;
  data local_30;
  data local_20;
  
  val_local = val;
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    helicsDoubleString_abi_cxx11_((string *)&cvec,(helics *)CONCAT44(in_register_00000034,type),val)
    ;
    json.m_data._0_8_ = cvec._M_value._8_8_;
    json.m_data.m_value = (json_value)cvec._M_value._0_8_;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&json);
    goto LAB_001e65ff;
  case HELICS_INT:
    cvec._M_value._0_8_ = (BADTYPE)val;
    goto LAB_001e6622;
  case HELICS_COMPLEX:
    cvec._M_value._8_8_ = 0;
    cvec._M_value._0_8_ = val;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,&cvec);
    break;
  case HELICS_VECTOR:
    ValueConverter<double>::convert(__return_storage_ptr__,&val_local,1);
    break;
  case HELICS_COMPLEX_VECTOR:
    cvec._M_value._8_8_ = 0;
    cvec._M_value._0_8_ = val;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,&cvec,1);
    break;
  case HELICS_NAMED_POINT:
    valname._M_str = "value";
    valname._M_len = 5;
    NamedPoint::NamedPoint((NamedPoint *)&cvec,valname,val);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&cvec);
LAB_001e65ff:
    std::__cxx11::string::~string((string *)&cvec);
    break;
  case HELICS_BOOL:
    pcVar3 = "+0";
    if (val != 0.0) {
      pcVar3 = "*1";
    }
    if (NAN(val)) {
      pcVar3 = "*1";
    }
    cvec._M_value._8_8_ = pcVar3 + 1;
    cvec._M_value._0_8_ = 1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&cvec);
    break;
  case HELICS_TIME:
    cvec._M_value._0_8_ = count_time<9,_long>::convert(val);
LAB_001e6622:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&cvec);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_DOUBLE);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_20.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_20.m_value;
      local_20.m_type = vVar1;
      local_20.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_20);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<double_&,_double,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_30,&val_local);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_30.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_30.m_value;
      local_30.m_type = vVar1;
      local_30.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_30);
      fileops::generateJsonString((string *)&cvec,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cvec);
      std::__cxx11::string::~string((string *)&cvec);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
  case HELICS_DOUBLE:
    ValueConverter<double>::convert(__return_storage_ptr__,&val_local);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, double val)
{
    switch (type) {
        case DataType::HELICS_DOUBLE:
        default:
            return ValueConverter<double>::convert(val);
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(val));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(val).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(std::complex<double>(val, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val != 0.0) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsDoubleString(val));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{"value", val});
        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cvec(val, 0.0);
            return ValueConverter<std::complex<double>>::convert(&cvec, 1);
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<double>::convert(&val, 1);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_DOUBLE);
            json["value"] = val;
            return fileops::generateJsonString(json);
        }
    }
}